

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  undefined8 *puVar1;
  StorageKind SVar2;
  pointer puVar3;
  Module *pMVar4;
  pointer pNVar5;
  pointer pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Function *pFVar9;
  Index IVar10;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var11;
  ulong uVar12;
  char *pcVar13;
  undefined1 *puVar14;
  MixedArena *pMVar15;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var16;
  Const *pCVar17;
  undefined1 *puVar18;
  Expression *pEVar19;
  undefined1 *puVar20;
  Expression *append;
  Expression *value;
  Break *args_1;
  Block *pBVar21;
  pointer puVar22;
  int x;
  Type type;
  Address AVar23;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  Module *pMVar24;
  Name NVar25;
  Signature SVar26;
  Name NVar27;
  string_view sVar28;
  undefined1 auVar29 [16];
  Expression EVar30;
  Expression EVar31;
  string_view sVar32;
  IString IVar33;
  Name name;
  optional<wasm::Type> type_00;
  HeapType local_e8;
  Type local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  Name loadMemoryName;
  char *local_c0;
  Block *local_70;
  undefined1 (*pauStack_68) [16];
  __single_object memory;
  Function *local_50;
  LocalSet *local_48;
  Builder local_40;
  Builder builder;
  
  AVar23.addr = numFuncs * 4 + 0x10007 >> 0x10;
  pMVar24 = this->wasm;
  puVar3 = (pMVar24->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar3 == (pMVar24->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    auVar29 = wasm::IString::interned(1,"0",0);
    pauStack_68 = (undefined1 (*) [16])operator_new(0x58);
    *(undefined8 *)pauStack_68[1] = 0;
    *(undefined8 *)(pauStack_68[1] + 8) = 0;
    *(undefined8 *)pauStack_68[2] = 0;
    *(undefined8 *)(pauStack_68[2] + 8) = 0;
    *(undefined8 *)pauStack_68[3] = 0;
    *(undefined8 *)(pauStack_68[3] + 8) = 0;
    *(undefined8 *)pauStack_68[4] = 0;
    *(undefined8 *)(pauStack_68[4] + 8) = 0;
    *pauStack_68 = auVar29;
    *(undefined8 *)pauStack_68[4] = 0x10000;
    *(undefined8 *)pauStack_68[5] = 2;
    wasm::Module::addMemory((unique_ptr *)pMVar24);
    if (pauStack_68 != (undefined1 (*) [16])0x0) {
      operator_delete(pauStack_68,0x58);
    }
    pMVar24 = this->wasm;
    _Var11._M_head_impl =
         *(Memory **)
          &(((pMVar24->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    *(address64_t *)((long)_Var11._M_head_impl + 0x38) = AVar23.addr;
  }
  else {
    _Var11._M_head_impl =
         (puVar3->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if ((AVar23.addr <= ((_Var11._M_head_impl)->initial).addr) ||
       (((_Var11._M_head_impl)->initial).addr = AVar23.addr,
       AVar23.addr <= ((_Var11._M_head_impl)->max).addr)) goto LAB_0011fa2f;
  }
  ((_Var11._M_head_impl)->max).addr = AVar23.addr;
LAB_0011fa2f:
  pMVar4 = *(Module **)&(_Var11._M_head_impl)->addressType;
  NVar25.super_IString.str =
       (IString)wasm::IString::interned
                          ((this->config->profileExport)._M_string_length,
                           (this->config->profileExport)._M_dataplus._M_p,0);
  sVar28 = (string_view)Names::getValidFunctionName(pMVar24,NVar25);
  builder.wasm = (Module *)0x2;
  local_40.wasm = pMVar4;
  wasm::Type::Type(&local_e0,&local_40,2);
  SVar26.results.id = 2;
  SVar26.params.id = local_e0.id;
  wasm::HeapType::HeapType(&local_e8,SVar26);
  type.id = (uintptr_t)&pauStack_68;
  pauStack_68 = (undefined1 (*) [16])0x0;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
  NVar25.super_IString.str._M_str = (char *)sVar28._M_len;
  NVar25.super_IString.str._M_len = (size_t)&local_50;
  Builder::makeFunction
            (NVar25,(HeapType)sVar28._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e8.id,(Expression *)type.id);
  if (pauStack_68 != (undefined1 (*) [16])0x0) {
    operator_delete(pauStack_68,-(long)pauStack_68);
  }
  pFVar9 = local_50;
  (local_50->super_Importable).super_Named.hasExplicitName = true;
  unique0x10001bb5 = sVar28;
  uVar12 = wasm::IString::interned(4,"addr",0);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar12;
  wasm::Function::setLocalName((uint)pFVar9,(Name)(auVar29 << 0x40));
  pFVar9 = local_50;
  pcVar13 = (char *)wasm::IString::interned(4,"size",0);
  NVar27.super_IString.str._M_str = pcVar13;
  NVar27.super_IString.str._M_len = 1;
  wasm::Function::setLocalName((uint)pFVar9,NVar27);
  local_40.wasm = this->wasm;
  puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  *puVar14 = 8;
  *(undefined4 *)(puVar14 + 0x10) = 0;
  *(Module **)(puVar14 + 8) = pMVar4;
  pMVar15 = (MixedArena *)Builder::makeConst<long>(&local_40,this->moduleHash);
  _Var16._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((this->wasm->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
  pauStack_68 = *(undefined1 (**) [16])
                 _Var16._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
        &((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
         ((long)_Var16._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8))->_M_t;
  local_70 = (Block *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
  *(undefined8 *)&(local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression = 0
  ;
  (local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (local_70->name).super_IString.str._M_len = 0;
  (local_70->name).super_IString.str._M_str = (char *)0x0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = StoreId;
  *(undefined1 *)&(local_70->name).super_IString.str._M_len = 8;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x1;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = (size_t)puVar14;
  (local_70->list).allocator = pMVar15;
  *(undefined8 *)&local_70[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression = 3
  ;
  local_70[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression.type.id =
       (uintptr_t)pauStack_68;
  local_70[1].name.super_IString.str._M_len =
       (size_t)memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  wasm::Store::finalize();
  pFVar9 = local_50;
  SVar2 = this->config->storageKind;
  if (SVar2 - InMemory < 2) {
    auVar29 = wasm::IString::interned(7,"funcIdx",0);
    name.super_IString.str._M_len = auVar29._8_8_;
    name.super_IString.str._M_str = (char *)0x2;
    IVar10 = Builder::addVar((Builder *)pFVar9,auVar29._0_8_,name,type);
    local_48 = (LocalSet *)CONCAT44(local_48._4_4_,IVar10);
    if (this->config->storageKind == InMemory) {
      _Var16._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    else {
      _Var16._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)&this->secondaryMemory;
    }
    uStack_d8 = *(undefined4 *)
                 _Var16._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_d4 = *(undefined4 *)
                 ((long)_Var16._M_t.
                        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 4);
    loadMemoryName.super_IString.str._M_len._0_4_ =
         *(undefined4 *)
          ((long)_Var16._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    loadMemoryName.super_IString.str._M_len._4_4_ =
         *(undefined4 *)
          ((long)_Var16._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0xc);
    sVar28 = (string_view)wasm::IString::interned(5,"outer",0);
    EVar30 = (Expression)wasm::IString::interned(1,"l",0);
    EVar31 = (Expression)wasm::IString::interned(5,"outer",0);
    puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    *(Index *)(puVar14 + 0x10) = (Index)local_48;
    *(undefined8 *)(puVar14 + 8) = 2;
    pCVar17 = Builder::makeConst<unsigned_int>(&local_40,(uint)numFuncs);
    puVar18 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar18 = 0x10;
    *(undefined8 *)(puVar18 + 8) = 0;
    *(undefined4 *)(puVar18 + 0x10) = 0xf;
    *(undefined1 **)(puVar18 + 0x18) = puVar14;
    *(Const **)(puVar18 + 0x20) = pCVar17;
    wasm::Binary::finalize();
    pEVar19 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    pEVar19->_id = BreakId;
    (pEVar19->type).id = 1;
    pEVar19[1] = EVar31;
    *(undefined8 *)(pEVar19 + 2) = 0;
    pEVar19[2].type.id = (uintptr_t)puVar18;
    wasm::Break::finalize();
    puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    *(undefined4 *)(puVar14 + 0x10) = 0;
    *(Module **)(puVar14 + 8) = pMVar4;
    puVar18 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar18 = 8;
    *(Index *)(puVar18 + 0x10) = (Index)local_48;
    *(undefined8 *)(puVar18 + 8) = 2;
    pCVar17 = Builder::makeConst<unsigned_int>(&local_40,4);
    puVar20 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar20 = 0x10;
    *(undefined8 *)(puVar20 + 8) = 0;
    *(undefined4 *)(puVar20 + 0x10) = 2;
    *(undefined1 **)(puVar20 + 0x18) = puVar18;
    *(Const **)(puVar20 + 0x20) = pCVar17;
    wasm::Binary::finalize();
    puVar18 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar18 = 0x10;
    *(undefined8 *)(puVar18 + 8) = 0;
    *(undefined4 *)(puVar18 + 0x10) = 0;
    *(undefined1 **)(puVar18 + 0x18) = puVar14;
    *(undefined1 **)(puVar18 + 0x20) = puVar20;
    wasm::Binary::finalize();
    puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    *(Index *)(puVar14 + 0x10) = (Index)local_48;
    *(undefined8 *)(puVar14 + 8) = 2;
    puVar20 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x48,8);
    *puVar20 = 0xc;
    puVar20[0x28] = 0;
    *(undefined2 *)(puVar20 + 0x10) = 1;
    *(undefined8 *)(puVar20 + 0x18) = 0;
    *(undefined8 *)(puVar20 + 0x20) = 1;
    *(undefined1 **)(puVar20 + 0x30) = puVar14;
    *(undefined8 *)(puVar20 + 8) = 2;
    *(ulong *)(puVar20 + 0x38) = CONCAT44(uStack_d4,uStack_d8);
    *(ulong *)(puVar20 + 0x40) =
         CONCAT44(loadMemoryName.super_IString.str._M_len._4_4_,
                  (undefined4)loadMemoryName.super_IString.str._M_len);
    wasm::Load::finalize();
    puVar20[0x28] = 1;
    _Var16._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    pauStack_68 = *(undefined1 (**) [16])
                   _Var16._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
          &((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
           ((long)_Var16._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8))->_M_t;
    append = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)append = 0;
    (append->type).id = 0;
    *(undefined8 *)(append + 1) = 0;
    append[1].type.id = 0;
    *(undefined8 *)(append + 2) = 0;
    append[2].type.id = 0;
    append->_id = StoreId;
    append[1]._id = BreakId;
    append[1].type.id = 8;
    *(undefined8 *)(append + 2) = 4;
    *(undefined1 **)(append + 3) = puVar18;
    append[3].type.id = (uintptr_t)puVar20;
    *(undefined8 *)(append + 4) = 2;
    append[4].type.id = (uintptr_t)pauStack_68;
    *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)(append + 5) =
         memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    wasm::Store::finalize();
    puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    *(Index *)(puVar14 + 0x10) = (Index)local_48;
    *(undefined8 *)(puVar14 + 8) = 2;
    pCVar17 = Builder::makeConst<unsigned_int>(&local_40,1);
    value = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    value->_id = BinaryId;
    (value->type).id = 0;
    *(undefined4 *)(value + 1) = 0;
    value[1].type.id = (uintptr_t)puVar14;
    *(Const **)(value + 2) = pCVar17;
    wasm::Binary::finalize();
    local_48 = Builder::makeLocalSet(&local_40,(Index)local_48,value);
    sVar32 = (string_view)wasm::IString::interned(1,"l",0);
    args_1 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
    (args_1->name).super_IString.str = sVar32;
    args_1->value = (Expression *)0x0;
    args_1->condition = (Expression *)0x0;
    wasm::Break::finalize();
    pBVar21 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        (&local_40,pEVar19,append,local_48,args_1);
    pEVar19 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar19->_id = LoopId;
    (pEVar19->type).id = 0;
    pEVar19[1] = EVar30;
    *(Block **)(pEVar19 + 2) = pBVar21;
    wasm::Loop::finalize(pEVar19);
    pBVar21 = Builder::makeBlock(&local_40,pEVar19);
    (pBVar21->name).super_IString.str = sVar28;
    wasm::Block::finalize(pBVar21);
    local_70 = Builder::blockify(&local_40,(Expression *)local_70,(Expression *)pBVar21);
  }
  else if (SVar2 == InGlobals) {
    pNVar5 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar6 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pNVar5 != pNVar6) {
      local_48 = (LocalSet *)0x0;
      do {
        puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
        puVar1 = (undefined8 *)((long)&(pNVar5->super_IString).str._M_len + (long)local_48 * 4);
        *puVar14 = 8;
        *(undefined4 *)(puVar14 + 0x10) = 0;
        *(Module **)(puVar14 + 8) = pMVar4;
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar18 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
        *puVar18 = 10;
        *(undefined8 *)(puVar18 + 0x10) = uVar7;
        *(undefined8 *)(puVar18 + 0x18) = uVar8;
        *(undefined8 *)(puVar18 + 8) = 2;
        _Var16._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (((this->wasm->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
        pauStack_68 = *(undefined1 (**) [16])
                       _Var16._M_t.
                       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                       super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
              &((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
               ((long)_Var16._M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8))->_M_t;
        pEVar19 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
        *(undefined8 *)pEVar19 = 0;
        (pEVar19->type).id = 0;
        *(undefined8 *)(pEVar19 + 1) = 0;
        pEVar19[1].type.id = 0;
        *(undefined8 *)(pEVar19 + 2) = 0;
        pEVar19[2].type.id = 0;
        pEVar19->_id = StoreId;
        pEVar19[1]._id = BreakId;
        pEVar19[1].type.id = (ulong)((int)local_48 + 8);
        *(undefined8 *)(pEVar19 + 2) = 1;
        *(undefined1 **)(pEVar19 + 3) = puVar14;
        pEVar19[3].type.id = (uintptr_t)puVar18;
        *(undefined8 *)(pEVar19 + 4) = 2;
        pEVar19[4].type.id = (uintptr_t)pauStack_68;
        *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
         (pEVar19 + 5) =
             memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        wasm::Store::finalize();
        local_70 = Builder::blockify(&local_40,(Expression *)local_70,pEVar19);
        local_48 = (LocalSet *)((long)local_48 + 4);
      } while ((pointer)(puVar1 + 2) != pNVar6);
    }
  }
  puVar14 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  *puVar14 = 8;
  *(undefined4 *)(puVar14 + 0x10) = 1;
  *(undefined8 *)(puVar14 + 8) = 2;
  x = (int)(numFuncs << 2) + 8;
  pCVar17 = Builder::makeConst<int>(&local_40,x);
  puVar18 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  *puVar18 = 0x10;
  *(undefined8 *)(puVar18 + 8) = 0;
  *(undefined4 *)(puVar18 + 0x10) = 0x18;
  *(undefined1 **)(puVar18 + 0x18) = puVar14;
  *(Const **)(puVar18 + 0x20) = pCVar17;
  wasm::Binary::finalize();
  pEVar19 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  pEVar19->_id = IfId;
  (pEVar19->type).id = 0;
  *(undefined1 **)(pEVar19 + 1) = puVar18;
  pEVar19[1].type.id = (uintptr_t)local_70;
  *(undefined8 *)(pEVar19 + 2) = 0;
  wasm::If::finalize(pEVar19);
  pCVar17 = Builder::makeConst<int>(&local_40,x);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_70;
  pBVar21 = Builder::makeSequence(&local_40,pEVar19,(Expression *)pCVar17,type_00);
  local_50->body = (Expression *)pBVar21;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar24 = this->wasm;
  auVar29 = wasm::IString::interned
                      ((this->config->profileExport)._M_string_length,
                       (this->config->profileExport)._M_dataplus._M_p,0);
  pauStack_68 = (undefined1 (*) [16])operator_new(0x30);
  *(char **)(pauStack_68[1] + 8) = loadMemoryName.super_IString.str._M_str;
  *(char **)pauStack_68[2] = local_c0;
  *pauStack_68 = auVar29;
  *(undefined4 *)pauStack_68[1] = 0;
  pauStack_68[2][8] = 0;
  wasm::Module::addExport((unique_ptr *)pMVar24);
  if (pauStack_68 != (undefined1 (*) [16])0x0) {
    operator_delete(pauStack_68,0x30);
  }
  pMVar24 = this->wasm;
  if (*(long *)((long)(((pMVar24->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x20
               ) == 0) {
    for (puVar22 = (pMVar24->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar22 !=
        (pMVar24->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar22 = puVar22 + 1) {
      if (((puVar22->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind == Memory)
      goto LAB_00120457;
    }
    auVar29 = wasm::IString::interned(0xe,"profile-memory",0);
    IVar33.str = (string_view)
                 Names::getValidExportName
                           (this->wasm,
                            (IString)*(IString *)
                                      (((this->wasm->memories).
                                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                      ._M_t);
    pauStack_68 = (undefined1 (*) [16])operator_new(0x30);
    ((IString *)(pauStack_68[1] + 8))->str = IVar33.str;
    *pauStack_68 = auVar29;
    *(undefined4 *)pauStack_68[1] = 2;
    pauStack_68[2][8] = 0;
    wasm::Module::addExport((unique_ptr *)pMVar24);
    if (pauStack_68 != (undefined1 (*) [16])0x0) {
      operator_delete(pauStack_68,0x30);
    }
  }
LAB_00120457:
  if (local_50 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_50,local_50);
  }
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  auto ptrType = wasm->memories[0]->addressType;

  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile =
    Builder::makeFunction(name, Signature({ptrType, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, ptrType); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}